

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_error.cc
# Opt level: O0

void QL_PrintError(RC rc)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  RC rc_local;
  
  if ((rc < 0x191) || (0x199 < rc)) {
    if ((-rc < 0x191) || (0x191 < -rc)) {
      if (rc == -0xb) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        poVar1 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::operator<<(poVar1,"\n");
      }
      else if (rc == 0) {
        std::operator<<((ostream *)&std::cerr,"QL_PrintError called with return code of 0\n");
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cerr,"QL error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,rc);
        std::operator<<(poVar1," is out of bounds\n");
      }
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cerr,"QL error: ");
      poVar1 = std::operator<<(poVar1,QL_ErrorMsg[-0x191 - rc]);
      std::operator<<(poVar1,"\n");
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"QL warning: ");
    poVar1 = std::operator<<(poVar1,QL_WarnMsg[rc + -0x191]);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void QL_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_QL_WARN && rc <= QL_LASTWARN)
    // Print warning
    cerr << "QL warning: " << QL_WarnMsg[rc - START_QL_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_QL_ERR && -rc < -QL_LASTERROR)
    // Print error
    cerr << "QL error: " << QL_ErrorMsg[-rc + START_QL_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "QL_PrintError called with return code of 0\n";
  else
    cerr << "QL error: " << rc << " is out of bounds\n";
}